

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void ts_lexer__mark_end(TSLexer *payload)

{
  long lVar1;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  TSRange *previous_included_range;
  TSRange *current_included_range;
  Lexer *self;
  TSLexer *payload_local;
  
  lVar1 = *(long *)(payload + 2) + (long)payload[2].mark_end * 0x18;
  if ((payload[2].mark_end == (_func_void_TSLexer_ptr *)0x0) ||
     (payload[1].lookahead != *(int *)(lVar1 + 0x10))) {
    payload[1].get_column = *(_func_uint32_t_TSLexer_ptr **)(payload + 1);
    *(undefined4 *)&payload[1].is_at_included_range_start = *(undefined4 *)&payload[1].advance;
  }
  else {
    uStack_30 = (undefined4)*(undefined8 *)(lVar1 + -0x10);
    uStack_2c = (undefined4)((ulong)*(undefined8 *)(lVar1 + -0x10) >> 0x20);
    payload[1].get_column =
         (_func_uint32_t_TSLexer_ptr *)CONCAT44(uStack_30,*(undefined4 *)(lVar1 + -4));
    *(undefined4 *)&payload[1].is_at_included_range_start = uStack_2c;
  }
  return;
}

Assistant:

static void ts_lexer__mark_end(TSLexer *payload) {
  Lexer *self = (Lexer *)payload;
  TSRange *current_included_range = &self->included_ranges[self->current_included_range_index];
  if (self->current_included_range_index > 0 &&
      self->current_position.bytes == current_included_range->start_byte) {
    TSRange *previous_included_range = current_included_range - 1;
    self->token_end_position = (Length) {
      previous_included_range->end_byte,
      previous_included_range->end_point,
    };
  } else {
    self->token_end_position = self->current_position;
  }
}